

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O2

int callback_file_skip(output_file *out,int64_t off)

{
  int iVar1;
  ulong uVar2;
  
  do {
    if (off < 1) {
      return 0;
    }
    uVar2 = 0x7fffffff;
    if ((ulong)off < 0x7fffffff) {
      uVar2 = off;
    }
    iVar1 = (**(code **)&out[1].chunk_cnt)(out[1].cur_out_ptr,0,uVar2);
    off = off - uVar2;
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

static int callback_file_skip(struct output_file* out, int64_t off) {
  struct output_file_callback* outc = to_output_file_callback(out);
  int to_write;
  int ret;

  while (off > 0) {
    to_write = std::min(off, (int64_t)INT_MAX);
    ret = outc->write(outc->priv, nullptr, to_write);
    if (ret < 0) {
      return ret;
    }
    off -= to_write;
  }

  return 0;
}